

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O1

void S_ParseSndInfo(bool redefine)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *logicalname;
  Node *pNVar4;
  int iVar5;
  long lVar6;
  undefined7 in_register_00000039;
  FMemLump FVar7;
  ulong uVar8;
  FMemLump local_48;
  undefined8 uStack_40;
  
  if (((int)CONCAT71(in_register_00000039,redefine) == 0) && (SavedPlayerSounds.Count != 0)) {
    SavedPlayerSounds.Count = 0;
  }
  addterm(S_ClearSoundData,"S_ClearSoundData");
  S_ClearSoundData();
  CurrentPitchMask = '\0';
  iVar2 = FWadCollection::CheckNumForFullName(&Wads,"DSEMPTY",true,0xd);
  iVar5 = 0;
  S_AddSound("{ no sound }",iVar2,(FScanner *)0x0);
  iVar2 = FWadCollection::GetNumLumps(&Wads);
  if (0 < iVar2) {
    do {
      iVar2 = FWadCollection::GetLumpNamespace(&Wads,iVar5);
      if (iVar2 == 9) {
        local_48.Block.Chars = (FString)(char *)0x2f786f7673;
        uStack_40._0_4_ = 0;
        uStack_40._4_4_ = 0;
        FWadCollection::GetLumpName(&Wads,(char *)((long)&local_48.Block.Chars + 5),iVar5);
        S_AddSound((char *)&local_48,iVar5,(FScanner *)0x0);
      }
      else if (iVar2 == 7) {
        FWadCollection::ReadLump((FWadCollection *)&local_48,0xa861c0);
        FVar7.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
        if (*(int *)((long)local_48.Block.Chars + -0xc) != 0) {
          FVar7.Block.Chars = local_48.Block.Chars;
        }
        iVar2 = FWadCollection::CheckNumForName(&Wads,(char *)((long)FVar7.Block.Chars + 0x14),6);
        if (iVar2 != -1) {
          logicalname = FWadCollection::GetLumpFullName(&Wads,iVar5);
          iVar2 = S_AddSound(logicalname,iVar2,(FScanner *)0x0);
          if (*(uint *)((long)FVar7.Block.Chars + 0xc) - 0xd < 0xfffffff8) {
            S_sfx.Array[iVar2].RawRate = 0x2b11;
          }
          else if (*(uint *)((long)FVar7.Block.Chars + 0xc) < 9) {
            S_sfx.Array[iVar2].RawRate = 0x5622;
          }
          else {
            S_sfx.Array[iVar2].RawRate = 0xac44;
          }
          *(ushort *)&S_sfx.Array[iVar2].field_0x30 = *(ushort *)&S_sfx.Array[iVar2].field_0x30 | 4;
          S_sfx.Array[iVar2].LoopStart = *(int *)((long)FVar7.Block.Chars + 0x10);
          iVar3 = FWadCollection::GetLumpIndexNum(&Wads,iVar5);
          pNVar4 = TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::GetNode
                             (&Ambients,iVar3);
          (pNVar4->Pair).Value.type = 3;
          (pNVar4->Pair).Value.periodmin = 0;
          (pNVar4->Pair).Value.periodmax = 0;
          (pNVar4->Pair).Value.volume = 1.0;
          (pNVar4->Pair).Value.attenuation = 1.0;
          (pNVar4->Pair).Value.sound.ID = iVar2;
        }
        FMemLump::~FMemLump(&local_48);
      }
      else if ((iVar2 == 0) && (bVar1 = FWadCollection::CheckLumpName(&Wads,iVar5,"SNDINFO"), bVar1)
              ) {
        S_AddSNDINFO(iVar5);
      }
      iVar5 = iVar5 + 1;
      iVar2 = FWadCollection::GetNumLumps(&Wads);
    } while (iVar5 < iVar2);
  }
  if (SavedPlayerSounds.Count != 0) {
    lVar6 = 0x10;
    uVar8 = 0;
    do {
      iVar2 = *(int *)((long)SavedPlayerSounds.Array + lVar6 + -0xc);
      iVar5 = *(int *)((long)SavedPlayerSounds.Array + lVar6 + -8);
      iVar3 = *(int *)((long)SavedPlayerSounds.Array + lVar6 + -4);
      if (*(char *)((long)&((SavedPlayerSounds.Array)->pclass).Index + lVar6) == '\x01') {
        S_AddPlayerSoundExisting
                  (FName::NameData.NameArray
                   [*(int *)((long)SavedPlayerSounds.Array + lVar6 + -0x10)].Text,iVar2,iVar5,iVar3,
                   false);
      }
      else {
        S_AddPlayerSound(FName::NameData.NameArray
                         [*(int *)((long)SavedPlayerSounds.Array + lVar6 + -0x10)].Text,iVar2,iVar5,
                         iVar3,false);
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x14;
    } while (uVar8 < SavedPlayerSounds.Count);
  }
  S_HashSounds();
  TArray<sfxinfo_t,_sfxinfo_t>::ShrinkToFit(&S_sfx);
  if (S_rnd.Count != 0) {
    TArray<FRandomSoundList,_FRandomSoundList>::ShrinkToFit(&S_rnd);
  }
  S_ShrinkPlayerSoundLists();
  sfx_empty = FWadCollection::CheckNumForName(&Wads,"dsempty",0xd);
  return;
}

Assistant:

void S_ParseSndInfo (bool redefine)
{
	int lump;

	if (!redefine) SavedPlayerSounds.Clear();	// clear skin sounds only for initial parsing.
	atterm (S_ClearSoundData);
	S_ClearSoundData();	// remove old sound data first!

	CurrentPitchMask = 0;
	S_AddSound ("{ no sound }", "DSEMPTY");	// Sound 0 is no sound at all
	for (lump = 0; lump < Wads.GetNumLumps(); ++lump)
	{
		switch (Wads.GetLumpNamespace (lump))
		{
		case ns_global:
			if (Wads.CheckLumpName (lump, "SNDINFO"))
			{
				S_AddSNDINFO (lump);
			}
			break;

		case ns_bloodsfx:
			S_AddBloodSFX (lump);
			break;

		case ns_strifevoices:
			S_AddStrifeVoice (lump);
			break;
		}
	}
	S_RestorePlayerSounds();
	S_HashSounds ();
	S_sfx.ShrinkToFit ();

	if (S_rnd.Size() > 0)
	{
		S_rnd.ShrinkToFit ();
	}

	S_ShrinkPlayerSoundLists ();

	sfx_empty = Wads.CheckNumForName ("dsempty", ns_sounds);
}